

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix_address.cpp
# Opt level: O0

result<sockpp::unix_address> *
sockpp::unix_address::create(result<sockpp::unix_address> *__return_storage_ptr__,string *path)

{
  ulong uVar1;
  unix_address local_90;
  string *local_18;
  string *path_local;
  
  local_18 = path;
  path_local = (string *)__return_storage_ptr__;
  uVar1 = std::__cxx11::string::length();
  if (uVar1 < 0x6d) {
    unix_address(&local_90,local_18);
    result<sockpp::unix_address>::result(__return_storage_ptr__,&local_90);
    ~unix_address(&local_90);
  }
  else {
    result<sockpp::unix_address>::result(__return_storage_ptr__,invalid_argument);
  }
  return __return_storage_ptr__;
}

Assistant:

result<unix_address> unix_address::create(const string& path) {
    if (path.length() > MAX_PATH_NAME)
        return errc::invalid_argument;

    return unix_address{path};
}